

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPReductionClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPReductionClause *this)

{
  OpenMPReductionClauseIdentifier OVar1;
  string clause_string;
  allocator<char> aaStack_58 [8];
  ulong local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"reduction ",aaStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)aaStack_58,"(",(allocator<char> *)&local_38);
  OVar1 = this->identifier;
  if (this->modifier < OMPC_REDUCTION_MODIFIER_unknown) {
    std::__cxx11::string::append((char *)aaStack_58);
  }
  if (1 < local_50) {
    std::__cxx11::string::append((char *)aaStack_58);
  }
  switch(OVar1) {
  case OMPC_REDUCTION_IDENTIFIER_plus:
    break;
  case OMPC_REDUCTION_IDENTIFIER_minus:
    break;
  case OMPC_REDUCTION_IDENTIFIER_mul:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitand:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitor:
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitxor:
    break;
  case OMPC_REDUCTION_IDENTIFIER_logand:
    break;
  case OMPC_REDUCTION_IDENTIFIER_logor:
    break;
  default:
    goto switchD_0015ddb1_caseD_8;
  case OMPC_REDUCTION_IDENTIFIER_max:
    break;
  case OMPC_REDUCTION_IDENTIFIER_min:
    break;
  case OMPC_REDUCTION_IDENTIFIER_user:
    std::__cxx11::string::string((string *)&local_38,(string *)&this->user_defined_identifier);
    std::__cxx11::string::append((string *)aaStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    goto switchD_0015ddb1_caseD_8;
  }
  std::__cxx11::string::append((char *)aaStack_58);
switchD_0015ddb1_caseD_8:
  if (1 < local_50) {
    std::__cxx11::string::append((char *)aaStack_58);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_38,&this->super_OpenMPClause);
  std::__cxx11::string::append((string *)aaStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::append((char *)aaStack_58);
  if (3 < local_50) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)aaStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPReductionClause::toString() {

    std::string result = "reduction ";
    std::string clause_string = "(";
    OpenMPReductionClauseModifier modifier = this->getModifier();
    OpenMPReductionClauseIdentifier identifier = this->getIdentifier();
    switch (modifier) {
        case OMPC_REDUCTION_MODIFIER_default:
            clause_string += "default";
            break;
        case OMPC_REDUCTION_MODIFIER_inscan:
            clause_string += "inscan";
            break;
        case OMPC_REDUCTION_MODIFIER_task:
            clause_string += "task";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ", ";
    };
    switch (identifier) {
        case OMPC_REDUCTION_IDENTIFIER_plus:
            clause_string += "+";
            break;
        case OMPC_REDUCTION_IDENTIFIER_minus:
            clause_string += "-";
            break;
        case OMPC_REDUCTION_IDENTIFIER_mul:
            clause_string += "*";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitand:
            clause_string += "&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitor:
            clause_string += "|";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitxor:
            clause_string += "^";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logand:
            clause_string += "&&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logor:
            clause_string += "||";
            break;
        case OMPC_REDUCTION_IDENTIFIER_min:
            clause_string += "min";
            break;
        case OMPC_REDUCTION_IDENTIFIER_max:
            clause_string += "max";
            break;
        case OMPC_REDUCTION_IDENTIFIER_user:
            clause_string += this->getUserDefinedIdentifier();
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}